

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O0

void anon_unknown.dwarf_a4093::testWriteCopyRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  ostream *poVar1;
  void *pvVar2;
  char *pcVar3;
  int in_ESI;
  int in_EDI;
  int i;
  string cpyFn;
  string srcFn;
  string *in_stack_000000c8;
  string *in_stack_000000d0;
  string *in_stack_00000328;
  int in_stack_00000334;
  string *in_stack_00000450;
  int local_68;
  string local_58 [8];
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_38 [48];
  int local_8;
  int local_4;
  
  local_8 = in_ESI;
  local_4 = in_EDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing file with ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1," part(s).");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  for (local_68 = 0; local_68 < local_8; local_68 = local_68 + 1) {
    generateRandomFile(in_stack_00000334,in_stack_00000328);
    copyFile(in_stack_000000d0,in_stack_000000c8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    readWholeFiles(in_stack_00000450);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
testWriteCopyRead (
    int                partNumber,
    int                runCount,
    int                randomReadCount,
    const std::string& tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    std::string srcFn = tempDir + "imf_test_copy_multipart_source.exr";
    std::string cpyFn = tempDir + "imf_test_copy_multipart_copy.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, srcFn);
        copyFile (srcFn, cpyFn);
        remove (srcFn.c_str ());
        readWholeFiles (cpyFn);
        remove (cpyFn.c_str ());

        cout << endl << flush;
    }
}